

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall QCss::Parser::parseElementName(Parser *this,QString *name)

{
  long lVar1;
  TokenType TVar2;
  Parser *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined1 local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TVar2 = lookup((Parser *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (TVar2 == IDENT) {
    lexem(in_RDI);
    QString::operator=((QString *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8);
    QString::~QString((QString *)0xa3bf4b);
  }
  else {
    if (TVar2 != STAR) {
      local_21 = false;
      goto LAB_00a3bf59;
    }
    QString::clear((QString *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  }
  local_21 = true;
LAB_00a3bf59:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool Parser::parseElementName(QString *name)
{
    switch (lookup()) {
        case STAR: name->clear(); break;
        case IDENT: *name = lexem(); break;
        default: return false;
    }
    return true;
}